

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O3

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computePrimalActivity
          (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *primal,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *activity,bool unscaled)

{
  int iVar1;
  int iVar2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *v;
  pointer pnVar3;
  cpp_dec_float<200U,_int,_void> *pcVar4;
  undefined8 *puVar5;
  long lVar6;
  long lVar7;
  Item *pIVar8;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *__range2;
  cpp_dec_float<200U,_int,_void> *pcVar9;
  int *piVar10;
  int *piVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  pointer pnVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  ulong uVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  ulong uVar17;
  long lVar18;
  byte bVar19;
  type t;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_d8;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar19 = 0;
  iVar2 = (int)((ulong)((long)(primal->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(primal->val).
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 7);
  if ((this->
      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .set.thenum != iVar2) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_b8.data._M_elems._0_8_ = local_b8.data._M_elems + 4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,
               "XSPXLP01 Primal vector for computing row activity has wrong dimension","");
    *puVar5 = &PTR__SPxException_0069d438;
    puVar5[1] = puVar5 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar5 + 1),local_b8.data._M_elems._0_8_,
               local_b8.data._M_elems._0_8_ + local_b8.data._M_elems._8_8_);
    *puVar5 = &PTR__SPxException_0069d410;
    __cxa_throw(puVar5,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  }
  if ((this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .set.thenum !=
      (int)((ulong)((long)(activity->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(activity->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 7)) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_b8.data._M_elems._0_8_ = local_b8.data._M_elems + 4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,
               "XSPXLP03 Activity vector computing row activity has wrong dimension","");
    *puVar5 = &PTR__SPxException_0069d438;
    puVar5[1] = puVar5 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar5 + 1),local_b8.data._M_elems._0_8_,
               local_b8.data._M_elems._0_8_ + local_b8.data._M_elems._8_8_);
    *puVar5 = &PTR__SPxException_0069d410;
    __cxa_throw(puVar5,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  }
  uVar17 = 0;
  if ((0 < iVar2) &&
     (pcVar9 = &((primal->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_backend,
     pcVar9->fpclass != cpp_dec_float_NaN)) {
    lVar18 = 0xf8;
    uVar15 = 0;
    do {
      uVar17 = uVar15;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&local_b8,0,(type *)0x0);
      iVar1 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (pcVar9,&local_b8);
      iVar2 = (this->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum;
      if (iVar1 != 0) goto LAB_004cf648;
      uVar15 = uVar17 + 1;
      if ((long)iVar2 <= (long)uVar15) break;
      pnVar3 = (primal->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar9 = &pnVar3[uVar15].m_backend;
      piVar11 = (int *)((long)(pnVar3->m_backend).data._M_elems + lVar18);
      lVar18 = lVar18 + 0x80;
    } while (*piVar11 != 2);
    uVar17 = uVar17 + 1;
  }
LAB_004cf648:
  if ((int)uVar17 < iVar2) {
    iVar2 = (this->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum;
    local_d8.
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x0;
    local_d8.
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .memsize = 0;
    local_d8.
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .memused = 0;
    local_d8._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006a69e0;
    local_d8.theelem =
         (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
    iVar1 = 2;
    if (0 < iVar2) {
      iVar1 = iVar2;
    }
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::allocMem(&local_d8,iVar1);
    uVar15 = uVar17 & 0xffffffff;
    if ((unscaled) && (this->_isScaled == true)) {
      (*this->lp_scaler->_vptr_SPxScaler[0x11])(this->lp_scaler,this,uVar17 & 0xffffffff,&local_d8);
      pnVar13 = (activity->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pnVar3 = (activity->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pnVar3 != pnVar13;
          pnVar3 = pnVar3 + 1) {
        (pnVar3->m_backend).fpclass = cpp_dec_float_finite;
        (pnVar3->m_backend).prec_elem = 0x1c;
        (pnVar3->m_backend).data._M_elems[0] = 0;
        (pnVar3->m_backend).data._M_elems[1] = 0;
        (pnVar3->m_backend).data._M_elems[2] = 0;
        (pnVar3->m_backend).data._M_elems[3] = 0;
        (pnVar3->m_backend).data._M_elems[4] = 0;
        (pnVar3->m_backend).data._M_elems[5] = 0;
        (pnVar3->m_backend).data._M_elems[6] = 0;
        (pnVar3->m_backend).data._M_elems[7] = 0;
        (pnVar3->m_backend).data._M_elems[8] = 0;
        (pnVar3->m_backend).data._M_elems[9] = 0;
        (pnVar3->m_backend).data._M_elems[10] = 0;
        (pnVar3->m_backend).data._M_elems[0xb] = 0;
        (pnVar3->m_backend).data._M_elems[0xc] = 0;
        (pnVar3->m_backend).data._M_elems[0xd] = 0;
        (pnVar3->m_backend).data._M_elems[0xe] = 0;
        (pnVar3->m_backend).data._M_elems[0xf] = 0;
        (pnVar3->m_backend).data._M_elems[0x10] = 0;
        (pnVar3->m_backend).data._M_elems[0x11] = 0;
        (pnVar3->m_backend).data._M_elems[0x12] = 0;
        (pnVar3->m_backend).data._M_elems[0x13] = 0;
        (pnVar3->m_backend).data._M_elems[0x14] = 0;
        (pnVar3->m_backend).data._M_elems[0x15] = 0;
        (pnVar3->m_backend).data._M_elems[0x16] = 0;
        (pnVar3->m_backend).data._M_elems[0x17] = 0;
        (pnVar3->m_backend).data._M_elems[0x18] = 0;
        (pnVar3->m_backend).data._M_elems[0x19] = 0;
        (pnVar3->m_backend).data._M_elems[0x1a] = 0;
        (pnVar3->m_backend).data._M_elems[0x1b] = 0;
        *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + 0x6d) = 0;
      }
      if (0 < (long)local_d8.
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .memused) {
        lVar18 = 0;
        do {
          piVar11 = (int *)((long)(&(local_d8.
                                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .m_elem)->val + 1) + lVar18);
          iVar2 = *piVar11;
          pnVar3 = (activity->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar10 = piVar11 + -0x20;
          pnVar13 = pnVar3 + iVar2;
          for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
            *(int *)&(pnVar13->m_backend).data = *piVar10;
            piVar10 = piVar10 + (ulong)bVar19 * -2 + 1;
            pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar19 * -2 + 1) * 4);
          }
          pnVar3[iVar2].m_backend.exp = piVar11[-4];
          pnVar3[iVar2].m_backend.neg = SUB41(piVar11[-3],0);
          iVar1 = piVar11[-1];
          pnVar3[iVar2].m_backend.fpclass = piVar11[-2];
          pnVar3[iVar2].m_backend.prec_elem = iVar1;
          lVar18 = lVar18 + 0x84;
        } while ((long)local_d8.
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused * 0x84 != lVar18);
      }
    }
    else {
      pIVar8 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem +
               (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey[uVar15].idx;
      pnVar13 = (activity->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pnVar3 = (activity->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pnVar3 != pnVar13;
          pnVar3 = pnVar3 + 1) {
        (pnVar3->m_backend).fpclass = cpp_dec_float_finite;
        (pnVar3->m_backend).prec_elem = 0x1c;
        (pnVar3->m_backend).data._M_elems[0] = 0;
        (pnVar3->m_backend).data._M_elems[1] = 0;
        (pnVar3->m_backend).data._M_elems[2] = 0;
        (pnVar3->m_backend).data._M_elems[3] = 0;
        (pnVar3->m_backend).data._M_elems[4] = 0;
        (pnVar3->m_backend).data._M_elems[5] = 0;
        (pnVar3->m_backend).data._M_elems[6] = 0;
        (pnVar3->m_backend).data._M_elems[7] = 0;
        (pnVar3->m_backend).data._M_elems[8] = 0;
        (pnVar3->m_backend).data._M_elems[9] = 0;
        (pnVar3->m_backend).data._M_elems[10] = 0;
        (pnVar3->m_backend).data._M_elems[0xb] = 0;
        (pnVar3->m_backend).data._M_elems[0xc] = 0;
        (pnVar3->m_backend).data._M_elems[0xd] = 0;
        (pnVar3->m_backend).data._M_elems[0xe] = 0;
        (pnVar3->m_backend).data._M_elems[0xf] = 0;
        (pnVar3->m_backend).data._M_elems[0x10] = 0;
        (pnVar3->m_backend).data._M_elems[0x11] = 0;
        (pnVar3->m_backend).data._M_elems[0x12] = 0;
        (pnVar3->m_backend).data._M_elems[0x13] = 0;
        (pnVar3->m_backend).data._M_elems[0x14] = 0;
        (pnVar3->m_backend).data._M_elems[0x15] = 0;
        (pnVar3->m_backend).data._M_elems[0x16] = 0;
        (pnVar3->m_backend).data._M_elems[0x17] = 0;
        (pnVar3->m_backend).data._M_elems[0x18] = 0;
        (pnVar3->m_backend).data._M_elems[0x19] = 0;
        (pnVar3->m_backend).data._M_elems[0x1a] = 0;
        (pnVar3->m_backend).data._M_elems[0x1b] = 0;
        *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + 0x6d) = 0;
      }
      if (0 < (pIVar8->data).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        lVar18 = 0x80;
        lVar6 = 0;
        do {
          piVar10 = (int *)((long)(((pIVar8->data).
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .m_elem)->val).m_backend.data._M_elems + lVar18);
          iVar2 = *piVar10;
          pnVar3 = (activity->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar11 = piVar10 + -0x20;
          pnVar13 = pnVar3 + iVar2;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            *(int *)&(pnVar13->m_backend).data = *piVar11;
            piVar11 = piVar11 + (ulong)bVar19 * -2 + 1;
            pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar19 * -2 + 1) * 4);
          }
          pnVar3[iVar2].m_backend.exp = piVar10[-4];
          pnVar3[iVar2].m_backend.neg = SUB41(piVar10[-3],0);
          iVar1 = piVar10[-1];
          pnVar3[iVar2].m_backend.fpclass = piVar10[-2];
          pnVar3[iVar2].m_backend.prec_elem = iVar1;
          lVar6 = lVar6 + 1;
          lVar18 = lVar18 + 0x84;
        } while (lVar6 < (pIVar8->data).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused);
      }
    }
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::operator*=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  *)activity,
                 (primal->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar15);
    if ((int)uVar17 + 1 <
        (this->
        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.thenum) {
      lVar18 = uVar15 + 1;
      pcVar9 = &local_b8;
      do {
        pnVar3 = (primal->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pnVar3[lVar18].m_backend.fpclass == cpp_dec_float_NaN) {
LAB_004cf8f9:
          if ((unscaled) && (this->_isScaled == true)) {
            (*this->lp_scaler->_vptr_SPxScaler[0x11])(this->lp_scaler,this,lVar18,&local_d8);
            lVar6 = (long)local_d8.
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused;
            if (0 < lVar6) {
              pcVar16 = &(primal->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar18].m_backend;
              uVar17 = lVar6 + 1;
              lVar6 = lVar6 * 0x84;
              do {
                pcVar4 = (cpp_dec_float<200U,_int,_void> *)
                         ((long)local_d8.
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .m_elem[-1].val.m_backend.data._M_elems + lVar6);
                pcVar12 = pcVar4;
                if (pcVar4 == pcVar9) {
                  pcVar12 = pcVar16;
                }
                local_b8.fpclass = cpp_dec_float_finite;
                local_b8.prec_elem = 0x1c;
                local_b8.data._M_elems[0] = 0;
                local_b8.data._M_elems[1] = 0;
                local_b8.data._M_elems[2] = 0;
                local_b8.data._M_elems[3] = 0;
                local_b8.data._M_elems[4] = 0;
                local_b8.data._M_elems[5] = 0;
                local_b8.data._M_elems[6] = 0;
                local_b8.data._M_elems[7] = 0;
                local_b8.data._M_elems[8] = 0;
                local_b8.data._M_elems[9] = 0;
                local_b8.data._M_elems[10] = 0;
                local_b8.data._M_elems[0xb] = 0;
                local_b8.data._M_elems[0xc] = 0;
                local_b8.data._M_elems[0xd] = 0;
                local_b8.data._M_elems[0xe] = 0;
                local_b8.data._M_elems[0xf] = 0;
                local_b8.data._M_elems[0x10] = 0;
                local_b8.data._M_elems[0x11] = 0;
                local_b8.data._M_elems[0x12] = 0;
                local_b8.data._M_elems[0x13] = 0;
                local_b8.data._M_elems[0x14] = 0;
                local_b8.data._M_elems[0x15] = 0;
                local_b8.data._M_elems[0x16] = 0;
                local_b8.data._M_elems[0x17] = 0;
                local_b8.data._M_elems[0x18] = 0;
                local_b8.data._M_elems[0x19] = 0;
                local_b8.data._M_elems._104_5_ = 0;
                local_b8.data._M_elems[0x1b]._1_3_ = 0;
                local_b8.exp = 0;
                local_b8.neg = false;
                if ((pcVar9 != pcVar16) && (pcVar4 != pcVar9)) {
                  pcVar12 = pcVar16;
                  pcVar14 = pcVar9;
                  for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
                    (pcVar14->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                    pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar12 + (ulong)bVar19 * -8 + 4);
                    pcVar14 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar14 + (ulong)bVar19 * -8 + 4);
                  }
                  local_b8.exp = pcVar16->exp;
                  local_b8.neg = pcVar16->neg;
                  local_b8.fpclass = pcVar16->fpclass;
                  local_b8.prec_elem = pcVar16->prec_elem;
                  pcVar12 = pcVar4;
                }
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                          (pcVar9,pcVar12);
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                          (&(activity->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start
                            [*(int *)((long)(&local_d8.
                                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              .m_elem[-1].val + 1) + lVar6)].m_backend,pcVar9);
                uVar17 = uVar17 - 1;
                lVar6 = lVar6 + -0x84;
              } while (1 < uVar17);
            }
          }
          else {
            pIVar8 = (this->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.theitem;
            iVar2 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thekey[lVar18].idx;
            lVar6 = (long)pIVar8[iVar2].data.
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused;
            if (0 < lVar6) {
              pcVar16 = &(primal->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar18].m_backend;
              pIVar8 = pIVar8 + iVar2;
              uVar17 = lVar6 + 1;
              lVar6 = lVar6 * 0x84;
              do {
                pcVar4 = (cpp_dec_float<200U,_int,_void> *)
                         ((long)(pIVar8->data).
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .m_elem[-1].val.m_backend.data._M_elems + lVar6);
                pcVar12 = pcVar4;
                if (pcVar4 == pcVar9) {
                  pcVar12 = pcVar16;
                }
                local_b8.fpclass = cpp_dec_float_finite;
                local_b8.prec_elem = 0x1c;
                local_b8.data._M_elems[0] = 0;
                local_b8.data._M_elems[1] = 0;
                local_b8.data._M_elems[2] = 0;
                local_b8.data._M_elems[3] = 0;
                local_b8.data._M_elems[4] = 0;
                local_b8.data._M_elems[5] = 0;
                local_b8.data._M_elems[6] = 0;
                local_b8.data._M_elems[7] = 0;
                local_b8.data._M_elems[8] = 0;
                local_b8.data._M_elems[9] = 0;
                local_b8.data._M_elems[10] = 0;
                local_b8.data._M_elems[0xb] = 0;
                local_b8.data._M_elems[0xc] = 0;
                local_b8.data._M_elems[0xd] = 0;
                local_b8.data._M_elems[0xe] = 0;
                local_b8.data._M_elems[0xf] = 0;
                local_b8.data._M_elems[0x10] = 0;
                local_b8.data._M_elems[0x11] = 0;
                local_b8.data._M_elems[0x12] = 0;
                local_b8.data._M_elems[0x13] = 0;
                local_b8.data._M_elems[0x14] = 0;
                local_b8.data._M_elems[0x15] = 0;
                local_b8.data._M_elems[0x16] = 0;
                local_b8.data._M_elems[0x17] = 0;
                local_b8.data._M_elems[0x18] = 0;
                local_b8.data._M_elems[0x19] = 0;
                local_b8.data._M_elems._104_5_ = 0;
                local_b8.data._M_elems[0x1b]._1_3_ = 0;
                local_b8.exp = 0;
                local_b8.neg = false;
                if ((pcVar9 != pcVar16) && (pcVar4 != pcVar9)) {
                  pcVar12 = pcVar16;
                  pcVar14 = pcVar9;
                  for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
                    (pcVar14->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                    pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar12 + (ulong)bVar19 * -8 + 4);
                    pcVar14 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar14 + (ulong)bVar19 * -8 + 4);
                  }
                  local_b8.exp = pcVar16->exp;
                  local_b8.neg = pcVar16->neg;
                  local_b8.fpclass = pcVar16->fpclass;
                  local_b8.prec_elem = pcVar16->prec_elem;
                  pcVar12 = pcVar4;
                }
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                          (pcVar9,pcVar12);
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                          (&(activity->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start
                            [*(int *)((long)(&(pIVar8->data).
                                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              .m_elem[-1].val + 1) + lVar6)].m_backend,pcVar9);
                uVar17 = uVar17 - 1;
                lVar6 = lVar6 + -0x84;
              } while (1 < uVar17);
            }
          }
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    (pcVar9,0,(type *)0x0);
          iVar2 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&pnVar3[lVar18].m_backend,pcVar9);
          if (iVar2 != 0) goto LAB_004cf8f9;
        }
        lVar18 = lVar18 + 1;
      } while ((int)lVar18 <
               (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
    }
    local_d8._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006a69e0;
    if (local_d8.theelem !=
        (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
      free(local_d8.theelem);
    }
  }
  else {
    pnVar13 = (activity->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pnVar3 = (activity->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pnVar3 != pnVar13; pnVar3 = pnVar3 + 1)
    {
      (pnVar3->m_backend).fpclass = cpp_dec_float_finite;
      (pnVar3->m_backend).prec_elem = 0x1c;
      (pnVar3->m_backend).data._M_elems[0] = 0;
      (pnVar3->m_backend).data._M_elems[1] = 0;
      (pnVar3->m_backend).data._M_elems[2] = 0;
      (pnVar3->m_backend).data._M_elems[3] = 0;
      (pnVar3->m_backend).data._M_elems[4] = 0;
      (pnVar3->m_backend).data._M_elems[5] = 0;
      (pnVar3->m_backend).data._M_elems[6] = 0;
      (pnVar3->m_backend).data._M_elems[7] = 0;
      (pnVar3->m_backend).data._M_elems[8] = 0;
      (pnVar3->m_backend).data._M_elems[9] = 0;
      (pnVar3->m_backend).data._M_elems[10] = 0;
      (pnVar3->m_backend).data._M_elems[0xb] = 0;
      (pnVar3->m_backend).data._M_elems[0xc] = 0;
      (pnVar3->m_backend).data._M_elems[0xd] = 0;
      (pnVar3->m_backend).data._M_elems[0xe] = 0;
      (pnVar3->m_backend).data._M_elems[0xf] = 0;
      (pnVar3->m_backend).data._M_elems[0x10] = 0;
      (pnVar3->m_backend).data._M_elems[0x11] = 0;
      (pnVar3->m_backend).data._M_elems[0x12] = 0;
      (pnVar3->m_backend).data._M_elems[0x13] = 0;
      (pnVar3->m_backend).data._M_elems[0x14] = 0;
      (pnVar3->m_backend).data._M_elems[0x15] = 0;
      (pnVar3->m_backend).data._M_elems[0x16] = 0;
      (pnVar3->m_backend).data._M_elems[0x17] = 0;
      (pnVar3->m_backend).data._M_elems[0x18] = 0;
      (pnVar3->m_backend).data._M_elems[0x19] = 0;
      (pnVar3->m_backend).data._M_elems[0x1a] = 0;
      (pnVar3->m_backend).data._M_elems[0x1b] = 0;
      *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + 0x6d) = 0;
    }
  }
  return;
}

Assistant:

inline
void SPxLPBase<R>::computePrimalActivity(const VectorBase<R>& primal, VectorBase<R>& activity,
      const bool unscaled) const
{
   if(primal.dim() != nCols())
      throw SPxInternalCodeException("XSPXLP01 Primal vector for computing row activity has wrong dimension");

   if(activity.dim() != nRows())
      throw SPxInternalCodeException("XSPXLP03 Activity vector computing row activity has wrong dimension");

   int c;

   for(c = 0; c < nCols() && primal[c] == 0; c++)
      ;

   if(c >= nCols())
   {
      activity.clear();
      return;
   }

   DSVectorBase<R> tmp(nRows());

   if(unscaled && _isScaled)
   {
      lp_scaler->getColUnscaled(*this, c, tmp);
      activity = tmp;
   }
   else
      activity = colVector(c);

   activity *= primal[c];
   c++;

   for(; c < nCols(); c++)
   {
      if(primal[c] != 0)
      {
         if(unscaled && _isScaled)
         {
            lp_scaler->getColUnscaled(*this, c, tmp);
            activity.multAdd(primal[c], tmp);
         }
         else
            activity.multAdd(primal[c], colVector(c));
      }
   }
}